

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardgestures.cpp
# Opt level: O1

Result __thiscall
QTapAndHoldGestureRecognizer::recognize
          (QTapAndHoldGestureRecognizer *this,QGesture *state,QObject *object,QEvent *event)

{
  ushort uVar1;
  long lVar2;
  ulong uVar3;
  QPoint QVar4;
  int iVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  lVar2 = *(long *)&state->field_0x8;
  if ((object == &state->super_QObject) && (*(short *)(event + 8) == 1)) {
    QBasicTimer::stop();
    return (Result)0x108;
  }
  uVar1 = *(ushort *)(event + 8);
  if (uVar1 < 0x9c) {
    if (4 < uVar1) {
      if (uVar1 == 5) {
        auVar14 = QEventPoint::globalPosition();
        if (*(int *)(lVar2 + 0xb8) == 0) {
          return (Result)0x10;
        }
        auVar11._0_8_ =
             (double)((ulong)auVar14._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar14._0_8_;
        auVar11._8_8_ =
             (double)((ulong)auVar14._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar14._8_8_;
        auVar14 = minpd(_DAT_0066f5d0,auVar11);
        auVar11 = maxpd(auVar14,_DAT_0066f5e0);
        auVar14._0_8_ =
             (double)((ulong)*(double *)(lVar2 + 0xa8) & 0x8000000000000000 | 0x3fe0000000000000) +
             *(double *)(lVar2 + 0xa8);
        auVar14._8_8_ =
             (double)((ulong)*(double *)(lVar2 + 0xb0) & 0x8000000000000000 | 0x3fe0000000000000) +
             *(double *)(lVar2 + 0xb0);
        auVar14 = minpd(_DAT_0066f5d0,auVar14);
        auVar14 = maxpd(auVar14,_DAT_0066f5e0);
        iVar10 = (int)auVar11._0_8_ - (int)auVar14._0_8_;
        iVar12 = (int)auVar11._8_8_ - (int)auVar14._8_8_;
        iVar5 = iVar10 >> 0x1f;
        iVar6 = iVar12 >> 0x1f;
        uVar3 = CONCAT44(iVar12,iVar10) ^ CONCAT44(iVar6,iVar5);
        iVar5 = ((int)(uVar3 >> 0x20) - iVar6) + ((int)uVar3 - iVar5);
      }
      else {
        if (uVar1 != 0x9b) {
          return (QFlagsStorageHelper<QGestureRecognizer::ResultFlag,_4>)
                 (QFlagsStorage<QGestureRecognizer::ResultFlag>)0x1;
        }
        QVar4 = QGraphicsSceneMouseEvent::screenPos((QGraphicsSceneMouseEvent *)event);
        if (*(int *)(lVar2 + 0xb8) == 0) {
          return (Result)0x10;
        }
        auVar15._0_8_ =
             (double)((ulong)*(double *)(lVar2 + 0xa8) & 0x8000000000000000 | 0x3fe0000000000000) +
             *(double *)(lVar2 + 0xa8);
        auVar15._8_8_ =
             (double)((ulong)*(double *)(lVar2 + 0xb0) & 0x8000000000000000 | 0x3fe0000000000000) +
             *(double *)(lVar2 + 0xb0);
        auVar14 = minpd(_DAT_0066f5d0,auVar15);
        auVar14 = maxpd(auVar14,_DAT_0066f5e0);
        iVar5 = QVar4.xp.m_i.m_i - (int)auVar14._0_8_;
        iVar6 = QVar4.yp.m_i.m_i - (int)auVar14._8_8_;
        iVar10 = iVar5 >> 0x1f;
        iVar12 = iVar6 >> 0x1f;
        uVar3 = CONCAT44(iVar6,iVar5) ^ CONCAT44(iVar12,iVar10);
        iVar5 = ((int)(uVar3 >> 0x20) - iVar12) + ((int)uVar3 - iVar10);
      }
LAB_002f4b33:
      if (0x28 < iVar5) {
        return (Result)0x10;
      }
      return (Result)2;
    }
    if (uVar1 != 2) {
      if (uVar1 != 3) {
        return (QFlagsStorageHelper<QGestureRecognizer::ResultFlag,_4>)
               (QFlagsStorage<QGestureRecognizer::ResultFlag>)0x1;
      }
      return (Result)0x10;
    }
    auVar14 = QEventPoint::globalPosition();
    auVar7._0_8_ = (double)((ulong)auVar14._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar14._0_8_;
    auVar7._8_8_ = (double)((ulong)auVar14._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar14._8_8_;
    auVar14 = minpd(_DAT_0066f5d0,auVar7);
    auVar14 = maxpd(auVar14,_DAT_0066f5e0);
    *(double *)(lVar2 + 0xa8) = (double)(int)auVar14._0_8_;
    *(double *)(lVar2 + 0xb0) = (double)(int)auVar14._8_8_;
  }
  else {
    if (uVar1 < 0xc2) {
      if (uVar1 != 0x9c) {
        if (uVar1 != 0x9d) {
          return (QFlagsStorageHelper<QGestureRecognizer::ResultFlag,_4>)
                 (QFlagsStorage<QGestureRecognizer::ResultFlag>)0x1;
        }
        return (Result)0x10;
      }
      QVar4 = QGraphicsSceneMouseEvent::screenPos((QGraphicsSceneMouseEvent *)event);
      auVar13._8_8_ = (double)QVar4.yp.m_i.m_i;
      auVar13._0_8_ = (double)QVar4.xp.m_i.m_i;
    }
    else {
      if (uVar1 != 0xc2) {
        if (uVar1 != 0xc3) {
          if (uVar1 != 0xc4) {
            return (QFlagsStorageHelper<QGestureRecognizer::ResultFlag,_4>)
                   (QFlagsStorage<QGestureRecognizer::ResultFlag>)0x1;
          }
          return (Result)0x10;
        }
        if (*(int *)(lVar2 + 0xb8) == 0) {
          return (Result)0x10;
        }
        if (*(long *)(event + 0x38) != 1) {
          return (Result)0x10;
        }
        auVar14 = QEventPoint::position();
        auVar15 = QEventPoint::pressPosition();
        auVar9._0_8_ = (double)((ulong)auVar14._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                       auVar14._8_8_;
        auVar9._8_8_ = (double)((ulong)auVar14._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                       auVar14._0_8_;
        auVar14 = minpd(_DAT_0066f5d0,auVar9);
        auVar11 = maxpd(auVar14,_DAT_0066f5e0);
        auVar8._0_8_ = (double)((ulong)auVar15._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                       auVar15._8_8_;
        auVar8._8_8_ = (double)((ulong)auVar15._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                       auVar15._0_8_;
        auVar14 = minpd(_DAT_0066f5d0,auVar8);
        auVar14 = maxpd(auVar14,_DAT_0066f5e0);
        iVar10 = (int)auVar11._0_8_ - (int)auVar14._0_8_;
        iVar12 = (int)auVar11._8_8_ - (int)auVar14._8_8_;
        iVar5 = iVar10 >> 0x1f;
        iVar6 = iVar12 >> 0x1f;
        uVar3 = CONCAT44(iVar12,iVar10) ^ CONCAT44(iVar6,iVar5);
        iVar5 = ((int)(uVar3 >> 0x20) - iVar6) + ((int)uVar3 - iVar5);
        goto LAB_002f4b33;
      }
      auVar13 = QEventPoint::globalPressPosition();
    }
    *(undefined1 (*) [16])(lVar2 + 0xa8) = auVar13;
  }
  QGesture::setHotSpot(state,(QPointF *)(lVar2 + 0xa8));
  QBasicTimer::start(lVar2 + 0xb8,(long)QTapAndHoldGesturePrivate::Timeout * 1000000,1,state);
  return (Result)2;
}

Assistant:

QGestureRecognizer::Result
QTapAndHoldGestureRecognizer::recognize(QGesture *state, QObject *object,
                                        QEvent *event)
{
    QTapAndHoldGesture *q = static_cast<QTapAndHoldGesture *>(state);
    QTapAndHoldGesturePrivate *d = q->d_func();

    if (object == state && event->type() == QEvent::Timer) {
        d->tapAndHoldTimer.stop();
        return QGestureRecognizer::FinishGesture | QGestureRecognizer::ConsumeEventHint;
    }

    enum { TapRadius = 40 };

    switch (event->type()) {
#if QT_CONFIG(graphicsview)
    case QEvent::GraphicsSceneMousePress: {
        const QGraphicsSceneMouseEvent *gsme = static_cast<const QGraphicsSceneMouseEvent *>(event);
        d->position = gsme->screenPos();
        q->setHotSpot(d->position);
        d->tapAndHoldTimer.start(QTapAndHoldGesturePrivate::Timeout * 1ms, q);
        return QGestureRecognizer::MayBeGesture; // we don't show a sign of life until the timeout
    }
#endif
    case QEvent::MouseButtonPress: {
        const QMouseEvent *me = static_cast<const QMouseEvent *>(event);
        d->position = me->globalPosition().toPoint();
        q->setHotSpot(d->position);
        d->tapAndHoldTimer.start(QTapAndHoldGesturePrivate::Timeout * 1ms, q);
        return QGestureRecognizer::MayBeGesture; // we don't show a sign of life until the timeout
    }
    case QEvent::TouchBegin: {
        const QTouchEvent *ev = static_cast<const QTouchEvent *>(event);
        d->position = ev->points().at(0).globalPressPosition();
        q->setHotSpot(d->position);
        d->tapAndHoldTimer.start(QTapAndHoldGesturePrivate::Timeout * 1ms, q);
        return QGestureRecognizer::MayBeGesture; // we don't show a sign of life until the timeout
    }
#if QT_CONFIG(graphicsview)
    case QEvent::GraphicsSceneMouseRelease:
#endif
    case QEvent::MouseButtonRelease:
    case QEvent::TouchEnd:
        return QGestureRecognizer::CancelGesture; // get out of the MayBeGesture state
    case QEvent::TouchUpdate: {
        const QTouchEvent *ev = static_cast<const QTouchEvent *>(event);
        if (d->tapAndHoldTimer.isActive() && ev->points().size() == 1) {
            const QEventPoint &p = ev->points().at(0);
            QPoint delta = p.position().toPoint() - p.pressPosition().toPoint();
            if (delta.manhattanLength() <= TapRadius)
                return QGestureRecognizer::MayBeGesture;
        }
        return QGestureRecognizer::CancelGesture;
    }
    case QEvent::MouseMove: {
        const QMouseEvent *me = static_cast<const QMouseEvent *>(event);
        QPoint delta = me->globalPosition().toPoint() - d->position.toPoint();
        if (d->tapAndHoldTimer.isActive() && delta.manhattanLength() <= TapRadius)
            return QGestureRecognizer::MayBeGesture;
        return QGestureRecognizer::CancelGesture;
    }
#if QT_CONFIG(graphicsview)
    case QEvent::GraphicsSceneMouseMove: {
        const QGraphicsSceneMouseEvent *gsme = static_cast<const QGraphicsSceneMouseEvent *>(event);
        QPoint delta = gsme->screenPos() - d->position.toPoint();
        if (d->tapAndHoldTimer.isActive() && delta.manhattanLength() <= TapRadius)
            return QGestureRecognizer::MayBeGesture;
        return QGestureRecognizer::CancelGesture;
    }
#endif
    default:
        return QGestureRecognizer::Ignore;
    }
}